

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  uint uVar1;
  short sVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  undefined4 uVar12;
  uint uVar13;
  ulong uVar14;
  ushort uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (bmi2 != 0) {
    ZSTD_buildFSETable_body_bmi2
              (dt,normalizedCounter,maxSymbolValue,baseValue,nbAdditionalBits,tableLog,wksp,wkspSize
              );
    return;
  }
  bVar3 = (byte)tableLog;
  uVar13 = 1 << (bVar3 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa655,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa656,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa657,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar1 = uVar13 - 1;
  uVar6 = (uint)(0x8000 << (bVar3 & 0x1f)) >> 0x10;
  uVar12 = 1;
  uVar14 = 0;
  uVar9 = (ulong)uVar1;
  do {
    uVar15 = normalizedCounter[uVar14];
    if (uVar15 == 0xffff) {
      dt[uVar9 + 1].baseValue = (U32)uVar14;
      uVar15 = 1;
      uVar9 = (ulong)((int)uVar9 - 1);
    }
    else {
      if ((short)uVar15 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa665,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if (uVar6 < uVar15 || uVar6 == uVar15) {
        uVar12 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar14 * 2) = uVar15;
    uVar14 = uVar14 + 1;
  } while (maxSymbolValue + 1 != uVar14);
  dt->nextState = (short)uVar12;
  dt->nbAdditionalBits = (char)((uint)uVar12 >> 0x10);
  dt->nbBits = (char)((uint)uVar12 >> 0x18);
  dt->baseValue = tableLog;
  auVar5 = _DAT_001e3030;
  auVar4 = _DAT_001e2fc0;
  if ((uint)uVar9 == uVar1) {
    iVar7 = (uVar13 >> 1) + (uVar13 >> 3) + 3;
    lVar16 = 0;
    lVar10 = 0;
    uVar9 = 0;
    do {
      uVar15 = normalizedCounter[uVar9];
      *(long *)((long)wksp + lVar16 + 0x6a) = lVar10;
      if (8 < (long)(short)uVar15) {
        uVar11 = 0x10;
        if (0x10 < uVar15) {
          uVar11 = uVar15;
        }
        uVar14 = (ulong)uVar11 - 9;
        auVar21._8_4_ = (int)uVar14;
        auVar21._0_8_ = uVar14;
        auVar21._12_4_ = (int)(uVar14 >> 0x20);
        auVar19._0_8_ = uVar14 >> 3;
        auVar19._8_8_ = auVar21._8_8_ >> 3;
        auVar19 = auVar19 ^ auVar5;
        uVar17 = 0;
        do {
          auVar20._8_4_ = (int)uVar17;
          auVar20._0_8_ = uVar17;
          auVar20._12_4_ = (int)(uVar17 >> 0x20);
          auVar21 = (auVar20 | auVar4) ^ auVar5;
          if ((bool)(~(auVar19._4_4_ < auVar21._4_4_ ||
                      auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar19._4_4_) & 1)) {
            *(long *)((long)wksp + uVar17 * 8 + lVar16 + 0x72) = lVar10;
          }
          if (auVar21._12_4_ <= auVar19._12_4_ &&
              (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
            *(long *)((long)wksp + uVar17 * 8 + lVar16 + 0x7a) = lVar10;
          }
          uVar17 = uVar17 + 2;
        } while (((uVar14 >> 3) + 2 & 0xfffffffffffffffe) != uVar17);
      }
      if ((short)uVar15 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa687,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar16 = lVar16 + (short)uVar15;
      lVar10 = lVar10 + 0x101010101010101;
      bVar18 = uVar9 != maxSymbolValue;
      uVar9 = uVar9 + 1;
    } while (bVar18);
    if ((uVar13 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa695,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar9 = 0;
    uVar6 = 0;
    do {
      dt[(ulong)(uVar6 & uVar1) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar9 + 0x6a);
      dt[(ulong)(uVar6 + iVar7 & uVar1) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar9 + 0x6b);
      uVar6 = uVar6 + iVar7 * 2 & uVar1;
      uVar9 = uVar9 + 2;
    } while (uVar9 < uVar13);
    if (uVar6 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa69e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar14 = 0;
    uVar6 = 0;
    do {
      sVar2 = normalizedCounter[uVar14];
      if (0 < sVar2) {
        iVar7 = 0;
        do {
          dt[(ulong)uVar6 + 1].baseValue = (U32)uVar14;
          do {
            uVar6 = uVar6 + (uVar13 >> 1) + (uVar13 >> 3) + 3 & uVar1;
          } while ((uint)uVar9 < uVar6);
          iVar7 = iVar7 + 1;
        } while (iVar7 != sVar2);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != maxSymbolValue + 1);
    if (uVar6 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa6ac,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar9 = 0;
  while( true ) {
    uVar14 = (ulong)dt[uVar9 + 1].baseValue;
    uVar15 = *(ushort *)((long)wksp + uVar14 * 2);
    *(ushort *)((long)wksp + uVar14 * 2) = uVar15 + 1;
    iVar7 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    bVar8 = bVar3 - (char)iVar7;
    dt[uVar9 + 1].nbBits = bVar8;
    dt[uVar9 + 1].nextState = (uVar15 << (bVar8 & 0x1f)) - (short)uVar13;
    if (nbAdditionalBits[uVar14] == 0xff) break;
    dt[uVar9 + 1].nbAdditionalBits = nbAdditionalBits[uVar14];
    dt[uVar9 + 1].baseValue = baseValue[uVar14];
    uVar9 = uVar9 + 1;
    if (uVar13 == uVar9) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa6b7,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}